

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_nls.c
# Opt level: O0

int CVodeSetNlsRhsFn(void *cvode_mem,CVRhsFn f)

{
  long in_RSI;
  long in_RDI;
  CVodeMem cv_mem;
  int local_4;
  
  if (in_RDI == 0) {
    cvProcessError((CVodeMem)0x0,-0x15,"CVODE","CVodeSetNlsRhsFn","cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    if (in_RSI == 0) {
      *(undefined8 *)(in_RDI + 0x3d8) = *(undefined8 *)(in_RDI + 0x10);
    }
    else {
      *(long *)(in_RDI + 0x3d8) = in_RSI;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CVodeSetNlsRhsFn(void *cvode_mem, CVRhsFn f)
{
  CVodeMem cv_mem;

  if (cvode_mem==NULL) {
    cvProcessError(NULL, CV_MEM_NULL, "CVODE", "CVodeSetNlsRhsFn",
                   MSGCV_NO_MEM);
    return(CV_MEM_NULL);
  }

  cv_mem = (CVodeMem) cvode_mem;

  if (f)
    cv_mem->nls_f = f;
  else
    cv_mem->nls_f = cv_mem->cv_f;

  return(CV_SUCCESS);
}